

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_vumeter.c
# Opt level: O2

void g_vumeter_setup(void)

{
  _class *p_Var1;
  t_symbol *ptVar2;
  
  ptVar2 = gensym("vu");
  vu_class = class_new(ptVar2,vu_new,vu_free,0x4c0,0,A_GIMME,0);
  class_addbang(vu_class,vu_bang);
  class_doaddfloat(vu_class,vu_float);
  p_Var1 = vu_class;
  ptVar2 = gensym("ft1");
  class_addmethod(p_Var1,vu_ft1,ptVar2,A_FLOAT,0);
  p_Var1 = vu_class;
  ptVar2 = gensym("dialog");
  class_addmethod(p_Var1,vu_dialog,ptVar2,A_GIMME,0);
  p_Var1 = vu_class;
  ptVar2 = gensym("size");
  class_addmethod(p_Var1,vu_size,ptVar2,A_GIMME,0);
  p_Var1 = vu_class;
  ptVar2 = gensym("scale");
  class_addmethod(p_Var1,vu_scale,ptVar2,A_DEFFLOAT,0);
  p_Var1 = vu_class;
  ptVar2 = gensym("delta");
  class_addmethod(p_Var1,vu_delta,ptVar2,A_GIMME,0);
  p_Var1 = vu_class;
  ptVar2 = gensym("pos");
  class_addmethod(p_Var1,vu_pos,ptVar2,A_GIMME,0);
  p_Var1 = vu_class;
  ptVar2 = gensym("color");
  class_addmethod(p_Var1,vu_color,ptVar2,A_GIMME,0);
  p_Var1 = vu_class;
  ptVar2 = gensym("receive");
  class_addmethod(p_Var1,vu_receive,ptVar2,A_DEFSYM,0);
  p_Var1 = vu_class;
  ptVar2 = gensym("label");
  class_addmethod(p_Var1,vu_label,ptVar2,A_DEFSYM,0);
  p_Var1 = vu_class;
  ptVar2 = gensym("label_pos");
  class_addmethod(p_Var1,vu_label_pos,ptVar2,A_GIMME,0);
  p_Var1 = vu_class;
  ptVar2 = gensym("label_font");
  class_addmethod(p_Var1,vu_label_font,ptVar2,A_GIMME,0);
  p_Var1 = vu_class;
  ptVar2 = gensym("zoom");
  class_addmethod(p_Var1,iemgui_zoom,ptVar2,A_CANT,0);
  vu_widgetbehavior.w_getrectfn = vu_getrect;
  vu_widgetbehavior.w_displacefn = iemgui_displace;
  vu_widgetbehavior.w_selectfn = iemgui_select;
  vu_widgetbehavior.w_activatefn = (t_activatefn)0x0;
  vu_widgetbehavior.w_deletefn = iemgui_delete;
  vu_widgetbehavior.w_visfn = iemgui_vis;
  vu_widgetbehavior.w_clickfn = (t_clickfn)0x0;
  class_setwidget(vu_class,&vu_widgetbehavior);
  class_setsavefn(vu_class,vu_save);
  class_setpropertiesfn(vu_class,vu_properties);
  return;
}

Assistant:

void g_vumeter_setup(void)
{
    vu_class = class_new(gensym("vu"), (t_newmethod)vu_new,
        (t_method)vu_free, sizeof(t_vu), 0, A_GIMME, 0);
    class_addbang(vu_class,vu_bang);
    class_addfloat(vu_class,vu_float);
    class_addmethod(vu_class, (t_method)vu_ft1,
        gensym("ft1"), A_FLOAT, 0);
    class_addmethod(vu_class, (t_method)vu_dialog,
        gensym("dialog"), A_GIMME, 0);
    class_addmethod(vu_class, (t_method)vu_size,
        gensym("size"), A_GIMME, 0);
    class_addmethod(vu_class, (t_method)vu_scale,
        gensym("scale"), A_DEFFLOAT, 0);
    class_addmethod(vu_class, (t_method)vu_delta,
        gensym("delta"), A_GIMME, 0);
    class_addmethod(vu_class, (t_method)vu_pos,
        gensym("pos"), A_GIMME, 0);
    class_addmethod(vu_class, (t_method)vu_color,
        gensym("color"), A_GIMME, 0);
    class_addmethod(vu_class, (t_method)vu_receive,
        gensym("receive"), A_DEFSYM, 0);
    class_addmethod(vu_class, (t_method)vu_label,
        gensym("label"), A_DEFSYM, 0);
    class_addmethod(vu_class, (t_method)vu_label_pos,
        gensym("label_pos"), A_GIMME, 0);
    class_addmethod(vu_class, (t_method)vu_label_font,
        gensym("label_font"), A_GIMME, 0);
    class_addmethod(vu_class, (t_method)iemgui_zoom,
        gensym("zoom"), A_CANT, 0);
    vu_widgetbehavior.w_getrectfn =    vu_getrect;
    vu_widgetbehavior.w_displacefn =   iemgui_displace;
    vu_widgetbehavior.w_selectfn =     iemgui_select;
    vu_widgetbehavior.w_activatefn =   NULL;
    vu_widgetbehavior.w_deletefn =     iemgui_delete;
    vu_widgetbehavior.w_visfn =        iemgui_vis;
    vu_widgetbehavior.w_clickfn =      NULL;
    class_setwidget(vu_class,&vu_widgetbehavior);
    class_setsavefn(vu_class, vu_save);
    class_setpropertiesfn(vu_class, vu_properties);
}